

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

size_t countSizeRequiredForString(size_t stringSize,uint8_t *string)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = 0;
  for (uVar2 = 0; uVar2 < stringSize; uVar2 = uVar2 + (string[uVar2] == '\\') + 1) {
    sVar1 = sVar1 + 1;
  }
  return sVar1;
}

Assistant:

static size_t countSizeRequiredForString(size_t stringSize, const uint8_t *string)
{
    size_t result = 0;
    for(size_t i = 0; i < stringSize; ++i)
    {
        uint8_t c = string[i];
        if(c == '\\')
            ++i;
        ++result;
    }

    return result;
}